

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O0

int evfilt_read_knote_create(filter *filt,knote *kn)

{
  int iVar1;
  long in_RSI;
  long in_RDI;
  knote *unaff_retaddr;
  filter *in_stack_00000008;
  int in_stack_00000010;
  int evfd;
  knote *in_stack_00000068;
  undefined1 local_3c [20];
  undefined4 local_28;
  undefined4 uStack_24;
  int local_1c;
  long local_18;
  long local_10;
  undefined1 in_stack_fffffffffffffffb;
  int in_stack_fffffffffffffffc;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  iVar1 = linux_get_descriptor_type(in_stack_00000068);
  if (iVar1 < 0) {
    iVar1 = -1;
  }
  else {
    *(undefined4 *)(local_18 + 0x78) = 0x2001;
    if ((*(ushort *)(local_18 + 10) & 0x20) != 0) {
      *(uint *)(local_18 + 0x78) = *(uint *)(local_18 + 0x78) | 0x80000000;
    }
    if ((*(uint *)(local_18 + 0x20) & 1) == 0) {
      iVar1 = epoll_update(in_stack_00000010,in_stack_00000008,unaff_retaddr,
                           in_stack_fffffffffffffffc,(_Bool)in_stack_fffffffffffffffb);
    }
    else {
      if (((*(ushort *)(local_18 + 10) & 0x10) != 0) || ((*(ushort *)(local_18 + 10) & 0x80) != 0))
      {
        *(uint *)(local_18 + 0x78) = *(uint *)(local_18 + 0x78) | 0x40000000;
      }
      *(undefined4 *)(local_18 + 0x68) = *(undefined4 *)(*(long *)(local_10 + 0x98) + 0x7c0);
      local_1c = eventfd(0,0);
      if (local_1c < 0) {
        iVar1 = -1;
      }
      else {
        iVar1 = eventfd_write(local_1c,1);
        if (iVar1 < 0) {
          close(local_1c);
          iVar1 = -1;
        }
        else {
          *(int *)(local_18 + 0x80) = local_1c;
          local_3c._12_8_ = local_18;
          local_28 = 1;
          *(long *)(local_18 + 0x98) = local_18;
          *(ulong *)(local_18 + 0xa0) = CONCAT44(uStack_24,1);
          local_3c._0_4_ = *(uint32_t *)(local_18 + 0x78);
          local_3c._4_8_ = local_18 + 0x98;
          iVar1 = epoll_ctl(*(int *)(local_18 + 0x68),1,*(int *)(local_18 + 0x80),
                            (epoll_event *)local_3c);
          if (iVar1 < 0) {
            close(local_1c);
            iVar1 = -1;
          }
          else {
            *(undefined4 *)(local_18 + 0x6c) = 1;
            iVar1 = 0;
          }
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int
evfilt_read_knote_create(struct filter *filt, struct knote *kn)
{
    if (linux_get_descriptor_type(kn) < 0)
        return (-1);

    /* Convert the kevent into an epoll_event */
#if defined(HAVE_EPOLLRDHUP)
    kn->epoll_events = EPOLLIN | EPOLLRDHUP;
#else
    kn->epoll_events = EPOLLIN;
#endif
    if (kn->kev.flags & EV_CLEAR)
        kn->epoll_events |= EPOLLET;

    /* Special case: for regular files, add a surrogate eventfd that is always readable */
    if (kn->kn_flags & KNFL_FILE) {
        int evfd;

        /*
         * We only set oneshot for cases where we're not going to
         * be using EPOLL_CTL_MOD.
         *
         * We rely on the common code disabling the event after
         * it's fired once.
         *
         * See this SO post for details:
         * https://stackoverflow.com/questions/59517961/how-should-i-use-epoll-to-read-and-write-from-the-same-fd
         */
        if (kn->kev.flags & EV_ONESHOT || kn->kev.flags & EV_DISPATCH)
            kn->epoll_events |= EPOLLONESHOT;

        kn->kn_epollfd = filter_epoll_fd(filt);
        evfd = eventfd(0, 0);
        if (evfd < 0) {
            dbg_perror("eventfd(2)");
            return (-1);
        }
        if (eventfd_write(evfd, 1) < 0) {
            dbg_perror("eventfd_write(3)");
            (void) close(evfd);
            return (-1);
        }

        kn->kn_eventfd = evfd;

        KN_UDATA(kn);   /* populate this knote's kn_udata field */
        if (epoll_ctl(kn->kn_epollfd, EPOLL_CTL_ADD, kn->kn_eventfd, EPOLL_EV_KN(kn->epoll_events, kn)) < 0) {
            dbg_printf("epoll_ctl(2): %s", strerror(errno));
            (void) close(evfd);
            return (-1);
        }

        kn->kn_registered = 1;

        return (0);
    }

    return epoll_update(EPOLL_CTL_ADD, filt, kn, kn->epoll_events, false);
}